

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void opj_t1_dec_refpass_step_raw
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 poshalf,OPJ_UINT32 ci)

{
  char cVar1;
  OPJ_UINT32 OVar2;
  undefined4 local_3c;
  opj_mqc_t *mqc;
  OPJ_UINT32 v;
  OPJ_UINT32 ci_local;
  OPJ_INT32 poshalf_local;
  OPJ_INT32 *datap_local;
  opj_flag_t *flagsp_local;
  opj_t1_t *t1_local;
  
  cVar1 = (char)ci;
  if ((*flagsp & 0x200010 << (cVar1 * '\x03' & 0x1fU)) == 0x10 << (cVar1 * '\x03' & 0x1fU)) {
    OVar2 = opj_mqc_raw_decode(&t1->mqc);
    local_3c = poshalf;
    if (OVar2 == *datap < 0) {
      local_3c = -poshalf;
    }
    *datap = local_3c + *datap;
    *flagsp = 0x100000 << (cVar1 * '\x03' & 0x1fU) | *flagsp;
  }
  return;
}

Assistant:

static INLINE void opj_t1_dec_refpass_step_raw(
    opj_t1_t *t1,
    opj_flag_t *flagsp,
    OPJ_INT32 *datap,
    OPJ_INT32 poshalf,
    OPJ_UINT32 ci)
{
    OPJ_UINT32 v;

    opj_mqc_t *mqc = &(t1->mqc);       /* RAW component */

    if ((*flagsp & ((T1_SIGMA_THIS | T1_PI_THIS) << (ci * 3U))) ==
            (T1_SIGMA_THIS << (ci * 3U))) {
        v = opj_mqc_raw_decode(mqc);
        *datap += (v ^ (*datap < 0)) ? poshalf : -poshalf;
        *flagsp |= T1_MU_THIS << (ci * 3U);
    }
}